

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-version.c
# Opt level: O0

int main(void)

{
  int iVar1;
  char *__s1;
  
  fprintf(_stderr,"Library version: \"%s\".\n","0.1.0");
  iVar1 = green_version();
  if (iVar1 != 100) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-version.c"
            ,0x13,"(green_version()) == (((0 * 10000) + (1 * 100) + 0))");
    abort();
  }
  __s1 = green_version_string();
  iVar1 = strcmp(__s1,"0.1.0");
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-version.c"
            ,0x14,"strcmp(green_version_string(), \"0\" \".\" \"1\" \".\" \"0\") == 0");
    abort();
  }
  iVar1 = _green_init(1,1);
  if (iVar1 != 1) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-version.c"
            ,0x24,"(_green_init(0+1, 1)) == (1)");
    abort();
  }
  iVar1 = _green_init(0,2);
  if (iVar1 != 1) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-version.c"
            ,0x25,"(_green_init(0, 1+1)) == (1)");
    abort();
  }
  return 0;
}

Assistant:

int main()
{
    fprintf(stderr, "Library version: \"%s\".\n", GREEN_VERSION_STRING);

    // Compile-time and run-time checks should be equal since we're not
    // building in a compatibility configuration.
    check_eq(green_version(), GREEN_VERSION);
    check_str_eq(green_version_string(), GREEN_VERSION_STRING);

    // Make sure ordering make sense.
    check_eq(GREEN_MAKE_VERSION(1, 0, 0),
             GREEN_MAKE_VERSION(1, 0, 0));
    check_lt(GREEN_MAKE_VERSION(1, 0, 0),
             GREEN_MAKE_VERSION(1, 0, 1));
    check_lt(GREEN_MAKE_VERSION(1, 0, 1),
             GREEN_MAKE_VERSION(1, 1, 0));
    check_lt(GREEN_MAKE_VERSION(1, 0, 0),
             GREEN_MAKE_VERSION(1, 1, 0));
    check_lt(GREEN_MAKE_VERSION(1, 0, 0),
             GREEN_MAKE_VERSION(2, 0, 0));
    check_lt(GREEN_MAKE_VERSION(1, 1, 0),
             GREEN_MAKE_VERSION(2, 0, 0));

    check_eq(_green_init(GREEN_MAJOR+1, GREEN_MINOR), 1);
    check_eq(_green_init(GREEN_MAJOR, GREEN_MINOR+1), 1);

    return EXIT_SUCCESS;
}